

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O2

string * duckdb_httplib::detail::if2ip
                   (string *__return_storage_ptr__,int address_family,string *ifn)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  sockaddr *psVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  ifaddrs *piVar6;
  ifaddrs *ifap;
  string addr_candidate;
  char buf [16];
  undefined8 local_78;
  undefined6 uStack_70;
  undefined2 uStack_6a;
  undefined6 uStack_68;
  undefined8 uStack_62;
  undefined1 local_5a [10];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  piVar6 = (ifaddrs *)&ifap;
  getifaddrs(piVar6);
  paVar1 = &addr_candidate.field_2;
  addr_candidate._M_dataplus._M_p = (pointer)paVar1;
  addr_candidate._M_string_length = 0;
  addr_candidate.field_2._M_local_buf[0] = '\0';
  do {
    do {
      while( true ) {
        do {
          do {
            do {
              piVar6 = piVar6->ifa_next;
              if (piVar6 == (ifaddrs *)0x0) {
                freeifaddrs(ifap);
                (__return_storage_ptr__->_M_dataplus)._M_p =
                     (pointer)&__return_storage_ptr__->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)addr_candidate._M_dataplus._M_p == paVar1) {
                  (__return_storage_ptr__->field_2)._M_allocated_capacity =
                       CONCAT71(addr_candidate.field_2._M_allocated_capacity._1_7_,
                                addr_candidate.field_2._M_local_buf[0]);
                  *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
                       addr_candidate.field_2._8_8_;
                }
                else {
                  (__return_storage_ptr__->_M_dataplus)._M_p = addr_candidate._M_dataplus._M_p;
                  (__return_storage_ptr__->field_2)._M_allocated_capacity =
                       CONCAT71(addr_candidate.field_2._M_allocated_capacity._1_7_,
                                addr_candidate.field_2._M_local_buf[0]);
                }
                __return_storage_ptr__->_M_string_length = addr_candidate._M_string_length;
                addr_candidate._M_string_length = 0;
                addr_candidate.field_2._M_local_buf[0] = '\0';
                addr_candidate._M_dataplus._M_p = (pointer)paVar1;
                goto LAB_01443148;
              }
            } while (piVar6->ifa_addr == (sockaddr *)0x0);
            bVar3 = std::operator==(ifn,piVar6->ifa_name);
          } while (!bVar3);
          psVar2 = piVar6->ifa_addr;
          uVar4 = (uint)psVar2->sa_family;
        } while ((address_family != 0) && (uVar4 != address_family));
        if (uVar4 != 10) break;
        if ((*(uint *)(psVar2->sa_data + 6) & 0xc0ff) != 0x80fe) {
          uStack_68 = 0;
          uStack_62 = 0;
          local_78 = 0;
          uStack_70 = 0;
          uStack_6a = 0;
          buf[0] = '\0';
          buf[1] = '\0';
          buf[2] = '\0';
          buf[3] = '\0';
          buf[4] = '\0';
          buf[5] = '\0';
          buf[6] = '\0';
          buf[7] = '\0';
          buf[8] = '\0';
          buf[9] = '\0';
          buf[10] = '\0';
          buf[0xb] = '\0';
          buf[0xc] = '\0';
          buf[0xd] = '\0';
          buf[0xe] = '\0';
          buf[0xf] = '\0';
          pcVar5 = inet_ntop(10,psVar2->sa_data + 6,buf,0x2e);
          if (pcVar5 != (char *)0x0) {
            if ((psVar2->sa_data[6] & 0xfeU) != 0xfc) {
              freeifaddrs(ifap);
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)__return_storage_ptr__,buf,local_5a);
              goto LAB_01443148;
            }
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_50,buf,local_5a);
            std::__cxx11::string::operator=((string *)&addr_candidate,(string *)local_50);
            std::__cxx11::string::~string((string *)local_50);
          }
        }
      }
    } while (uVar4 != 2);
    pcVar5 = inet_ntop(2,psVar2->sa_data + 2,buf,0x10);
  } while (pcVar5 == (char *)0x0);
  freeifaddrs(ifap);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,buf,&local_78);
LAB_01443148:
  std::__cxx11::string::~string((string *)&addr_candidate);
  return __return_storage_ptr__;
}

Assistant:

inline std::string if2ip(int address_family, const std::string &ifn) {
  struct ifaddrs *ifap;
  getifaddrs(&ifap);
  std::string addr_candidate;
  for (auto ifa = ifap; ifa; ifa = ifa->ifa_next) {
    if (ifa->ifa_addr && ifn == ifa->ifa_name &&
        (AF_UNSPEC == address_family ||
         ifa->ifa_addr->sa_family == address_family)) {
      if (ifa->ifa_addr->sa_family == AF_INET) {
        auto sa = reinterpret_cast<struct sockaddr_in *>(ifa->ifa_addr);
        char buf[INET_ADDRSTRLEN];
        if (inet_ntop(AF_INET, &sa->sin_addr, buf, INET_ADDRSTRLEN)) {
          freeifaddrs(ifap);
          return std::string(buf, INET_ADDRSTRLEN);
        }
      } else if (ifa->ifa_addr->sa_family == AF_INET6) {
        auto sa = reinterpret_cast<struct sockaddr_in6 *>(ifa->ifa_addr);
        if (!IN6_IS_ADDR_LINKLOCAL(&sa->sin6_addr)) {
          char buf[INET6_ADDRSTRLEN] = {};
          if (inet_ntop(AF_INET6, &sa->sin6_addr, buf, INET6_ADDRSTRLEN)) {
            // equivalent to mac's IN6_IS_ADDR_UNIQUE_LOCAL
            auto s6_addr_head = sa->sin6_addr.s6_addr[0];
            if (s6_addr_head == 0xfc || s6_addr_head == 0xfd) {
              addr_candidate = std::string(buf, INET6_ADDRSTRLEN);
            } else {
              freeifaddrs(ifap);
              return std::string(buf, INET6_ADDRSTRLEN);
            }
          }
        }
      }
    }
  }
  freeifaddrs(ifap);
  return addr_candidate;
}